

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.h
# Opt level: O0

void Enum(void)

{
  pointer *ppdVar1;
  double dVar2;
  double dVar3;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  bool bVar4;
  _Setw _Var5;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar6;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  vector<double,_std::allocator<double>_> *pvVar10;
  reference pvVar11;
  reference pdVar12;
  iterator iVar13;
  iterator __last;
  ostream *poVar14;
  difference_type dVar15;
  double *i_6;
  iterator __end1_5;
  iterator __begin1_5;
  vector<double,_std::allocator<double>_> *__range1_5;
  size_t j_2;
  size_t i_5;
  double local_218 [5];
  iterator local_1f0;
  size_type local_1e8;
  undefined1 local_1e0 [8];
  vector<double,_std::allocator<double>_> result;
  double *i_4;
  iterator __end1_4;
  iterator __begin1_4;
  vector<double,_std::allocator<double>_> *__range1_4;
  double *i_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<double,_std::allocator<double>_> *__range1_3;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  vector<double,_std::allocator<double>_> **local_158;
  undefined8 local_150;
  int local_144;
  double *local_140;
  double *i_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<double,_std::allocator<double>_> *__range1_2;
  double local_118 [7];
  iterator local_e0;
  size_type local_d8;
  undefined1 local_d0 [8];
  vector<double,_std::allocator<double>_> expertopinion;
  ulong local_a0;
  size_t j_1;
  vector<double,_std::allocator<double>_> *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1_1;
  size_t j;
  vector<double,_std::allocator<double>_> *i;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  iterator res;
  vector<double,_std::allocator<double>_> length;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&length.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,&marks);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&res);
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
  __normal_iterator(&local_40);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)&res,4);
  ppdVar1 = &length.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  __end1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::begin((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)ppdVar1);
  i = (vector<double,_std::allocator<double>_> *)
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)ppdVar1);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                     *)&i), bVar4) {
    pvVar7 = __gnu_cxx::
             __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
             ::operator*(&__end1);
    for (__range1_1 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)0x0;
        pvVar6 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)std::vector<double,_std::allocator<double>_>::size(pvVar7), __range1_1 < pvVar6;
        __range1_1 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)((long)&(__range1_1->
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1)) {
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          (pvVar7,(size_type)__range1_1);
      dVar2 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)&res,(size_type)__range1_1);
      *pvVar11 = dVar2 + *pvVar11;
    }
    __gnu_cxx::
    __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator++(&__end1);
  }
  ppdVar1 = &length.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  __end1_1 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::begin((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)ppdVar1);
  i_1 = (vector<double,_std::allocator<double>_> *)
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)ppdVar1);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                             *)&i_1), bVar4) {
    pvVar7 = __gnu_cxx::
             __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
             ::operator*(&__end1_1);
    for (local_a0 = 0; sVar8 = std::vector<double,_std::allocator<double>_>::size(pvVar7),
        local_a0 < sVar8; local_a0 = local_a0 + 1) {
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)&res,local_a0);
      dVar2 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,local_a0);
      *pvVar11 = *pvVar11 / dVar2;
    }
    __gnu_cxx::
    __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::operator<<((ostream *)&std::cout,"\nNormalized Matrix\n");
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&length.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  printMatrix((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  local_118[4] = 1.0;
  local_118[5] = 1.0;
  local_118[2] = 1.0;
  local_118[3] = 1.0;
  local_118[0] = 1.0;
  local_118[1] = 1.0;
  local_e0 = local_118;
  local_d8 = 6;
  std::allocator<double>::allocator((allocator<double> *)((long)&__range1_2 + 7));
  __l_01._M_len = local_d8;
  __l_01._M_array = local_e0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_d0,__l_01,
             (allocator<double> *)((long)&__range1_2 + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&__range1_2 + 7));
  std::operator<<((ostream *)&std::cout,"\nExpert Asseessment of criteria:");
  __end1_2 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)local_d0);
  i_2 = (double *)
        std::vector<double,_std::allocator<double>_>::end
                  ((vector<double,_std::allocator<double>_> *)local_d0);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)&i_2), bVar4) {
    local_140 = __gnu_cxx::
                __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                operator*(&__end1_2);
    local_144 = (int)std::setw(3);
    poVar14 = std::operator<<((ostream *)&std::cout,(_Setw)local_144);
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,*local_140);
    std::operator<<(poVar14," ");
    dVar2 = *local_140;
    sVar8 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_d0);
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_d0,sVar8 - 1);
    if ((dVar2 != *pvVar11) || (NAN(dVar2) || NAN(*pvVar11))) {
      std::operator<<((ostream *)&std::cout," ; ");
    }
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1_2);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  local_168 = 0x3ff0000000000000;
  uStack_160 = 0;
  __range1_3 = (vector<double,_std::allocator<double>_> *)0x4008000000000000;
  uStack_170 = 0x4000000000000000;
  local_158 = &__range1_3;
  local_150 = 4;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)local_158;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_d0,__l_00);
  std::operator<<((ostream *)&std::cout,"Criteria weights vector: ");
  __end1_3 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)local_d0);
  i_3 = (double *)
        std::vector<double,_std::allocator<double>_>::end
                  ((vector<double,_std::allocator<double>_> *)local_d0);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)&i_3), bVar4) {
    pdVar12 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
              ::operator*(&__end1_3);
    _Var5 = std::setw(3);
    poVar14 = std::operator<<((ostream *)&std::cout,_Var5);
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,*pdVar12);
    std::operator<<(poVar14," ");
    dVar2 = *pdVar12;
    sVar8 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_d0);
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_d0,sVar8 - 1);
    if ((dVar2 != *pvVar11) || (NAN(dVar2) || NAN(*pvVar11))) {
      std::operator<<((ostream *)&std::cout," ; ");
    }
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1_3);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  normalize((vector<double,_std::allocator<double>_> *)local_d0);
  std::operator<<((ostream *)&std::cout,"\nNormalized Vector of Weights:    \t");
  __end1_4 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)local_d0);
  i_4 = (double *)
        std::vector<double,_std::allocator<double>_>::end
                  ((vector<double,_std::allocator<double>_> *)local_d0);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_4,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)&i_4), bVar4) {
    pdVar12 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
              ::operator*(&__end1_4);
    result.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = std::setw(3);
    poVar14 = std::operator<<((ostream *)&std::cout,
                              result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,*pdVar12);
    std::operator<<(poVar14," ");
    dVar2 = *pdVar12;
    sVar8 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_d0);
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_d0,sVar8 - 1);
    if ((dVar2 != *pvVar11) || (NAN(dVar2) || NAN(*pvVar11))) {
      std::operator<<((ostream *)&std::cout," ; ");
    }
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1_4);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  local_218[2] = 0.0;
  local_218[3] = 0.0;
  local_218[0] = 0.0;
  local_218[1] = 0.0;
  local_1f0 = local_218;
  local_1e8 = 4;
  std::allocator<double>::allocator((allocator<double> *)((long)&i_5 + 7));
  __l._M_len = local_1e8;
  __l._M_array = local_1f0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_1e0,__l,
             (allocator<double> *)((long)&i_5 + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&i_5 + 7));
  for (j_2 = 0; sVar8 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)&length.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage), j_2 < sVar8;
      j_2 = j_2 + 1) {
    __range1_5 = (vector<double,_std::allocator<double>_> *)0x0;
    while( true ) {
      pvVar9 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&length.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,j_2);
      pvVar10 = (vector<double,_std::allocator<double>_> *)
                std::vector<double,_std::allocator<double>_>::size(pvVar9);
      if (pvVar10 <= __range1_5) break;
      pvVar9 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&length.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,j_2);
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          (pvVar9,(size_type)__range1_5);
      dVar2 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_d0,(size_type)__range1_5
                          );
      dVar3 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_1e0,j_2);
      *pvVar11 = dVar2 * dVar3 + *pvVar11;
      __range1_5 = (vector<double,_std::allocator<double>_> *)
                   ((long)&(__range1_5->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                           .super__Vector_impl_data._M_start + 1);
    }
  }
  std::operator<<((ostream *)&std::cout,"\n\nMatrix of values of the combined criterion:");
  __end1_5 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)local_1e0);
  i_6 = (double *)
        std::vector<double,_std::allocator<double>_>::end
                  ((vector<double,_std::allocator<double>_> *)local_1e0);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_5,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)&i_6), bVar4) {
    pdVar12 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
              ::operator*(&__end1_5);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pdVar12);
    std::operator<<(poVar14," ");
    dVar2 = *pdVar12;
    sVar8 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_1e0);
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_1e0,sVar8 - 1);
    if ((dVar2 != *pvVar11) || (NAN(dVar2) || NAN(*pvVar11))) {
      std::operator<<((ostream *)&std::cout," ; ");
    }
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1_5);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  iVar13 = std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_1e0);
  __last = std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)local_1e0);
  local_40 = std::
             max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                       (iVar13._M_current,__last._M_current);
  poVar14 = std::operator<<((ostream *)&std::cout,"\nHighest Value = ");
  iVar13 = std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_1e0);
  sVar8 = std::
          distance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     iVar13._M_current,local_40);
  pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)local_1e0,sVar8);
  std::ostream::operator<<(poVar14,*pvVar11);
  std::operator<<((ostream *)&std::cout,"\nBest choice is: ");
  iVar13 = std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_1e0);
  dVar15 = std::
           distance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                     ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                      iVar13._M_current,local_40);
  cars((int)dVar15);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *)&length.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)&res);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)local_d0);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)local_1e0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_1e0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_d0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&res);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&length.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Enum(){
    vector<vector<double>> temp(marks);
    vector<double> length;
    vector<double>::iterator res;
    length.resize(4);
    for(auto &i:temp){
        for(size_t j=0;j<i.size();j++)
            length[j]+=i[j];
    }
    for(auto &i:temp){
        for(size_t j=0;j<i.size();j++)
            i[j] /= length[j];
    }

    cout << "\nNormalized Matrix\n";
    printMatrix(temp);


    vector<double> expertopinion={1,1,1,1,1,1};
    cout << "\nExpert Asseessment of criteria:";
    for(const auto &i:expertopinion){
        cout << setw(3) << i << " ";
        if(i!=expertopinion[expertopinion.size()-1])
            cout << " ; ";
    }
    cout << endl;

    expertopinion={3,2,1,0};
    cout << "Criteria weights vector: ";
    for(const auto &i:expertopinion){
        cout << setw(3) << i << " ";
        if(i != expertopinion[expertopinion.size()-1])
            cout << " ; ";
    }
    cout << endl;

    normalize(expertopinion);
    cout << "\nNormalized Vector of Weights:    \t";
    for(const auto &i:expertopinion){
        cout << setw(3) << i << " ";
        if(i != expertopinion[expertopinion.size()-1])
            cout << " ; ";
    }
    cout << endl;

    vector<double> result={0,0,0,0};
    for(size_t i=0;i<temp.size();i++){
        for(size_t j=0;j<temp[i].size();j++)
            result[i]+=temp[i][j]*expertopinion[j];
    }

    cout << "\n\nMatrix of values of the combined criterion:";
    for(const auto &i:result){
        cout << i << " ";
        if(i!=result[result.size()-1])
            cout << " ; ";
    }
    cout << endl;

    res=max_element(result.begin(),result.end());
    cout << "\nHighest Value = " << result[distance(result.begin(),res)];
    cout << "\nBest choice is: ";
    cars(std::distance(result.begin(),res));

    temp.clear();
    length.clear();
    expertopinion.clear();
    result.clear();
}